

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O2

size_t __thiscall capnp::SchemaFile::DiskSchemaFile::hashCode(DiskSchemaFile *this)

{
  size_t sVar1;
  ReadableDirectory *pRVar2;
  String *part;
  String *pSVar3;
  String *pSVar4;
  char *pcVar5;
  char *pcVar6;
  
  pRVar2 = this->baseDir;
  pSVar3 = (this->path).parts.ptr;
  pSVar4 = pSVar3 + (this->path).parts.size_;
  for (; pSVar3 != pSVar4; pSVar3 = pSVar3 + 1) {
    pcVar5 = (pSVar3->content).ptr;
    sVar1 = (pSVar3->content).size_;
    pcVar6 = pcVar5 + (sVar1 - 1);
    if (sVar1 == 0) {
      pcVar5 = (char *)0x0;
      pcVar6 = (char *)0x0;
    }
    for (; pcVar5 != pcVar6; pcVar5 = pcVar5 + 1) {
      pRVar2 = (ReadableDirectory *)((long)pRVar2 * 0x21 ^ (long)*pcVar5);
    }
    pRVar2 = (ReadableDirectory *)((long)pRVar2 * 0x21 ^ 0x2f);
  }
  return (size_t)pRVar2;
}

Assistant:

size_t hashCode() const override {
    // djb hash with xor
    // TODO(someday):  Add hashing library to KJ.
    size_t result = reinterpret_cast<uintptr_t>(&baseDir);
    for (auto& part: path) {
      for (char c: part) {
        result = (result * 33) ^ c;
      }
      result = (result * 33) ^ '/';
    }
    return result;
  }